

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtcpserver.cpp
# Opt level: O1

void __thiscall QTcpServerPrivate::~QTcpServerPrivate(QTcpServerPrivate *this)

{
  Data *pDVar1;
  Data *pDVar2;
  
  *(undefined ***)this = &PTR__QTcpServerPrivate_002d1e48;
  (this->super_QAbstractSocketEngineReceiver)._vptr_QAbstractSocketEngineReceiver =
       (_func_int **)&PTR__QTcpServerPrivate_002d1eb8;
  QNetworkProxy::~QNetworkProxy(&this->proxy);
  pDVar1 = (this->serverSocketErrorString).d.d;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&((this->serverSocketErrorString).d.d)->super_QArrayData,2,0x10);
    }
  }
  QHostAddress::~QHostAddress(&this->address);
  pDVar2 = (this->pendingConnections).d.d;
  if (pDVar2 != (Data *)0x0) {
    LOCK();
    (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&((this->pendingConnections).d.d)->super_QArrayData,8,0x10);
    }
  }
  QObjectPrivate::~QObjectPrivate(&this->super_QObjectPrivate);
  return;
}

Assistant:

QTcpServerPrivate::~QTcpServerPrivate()
{
}